

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

void __thiscall icu_63::UVector32::assign(UVector32 *this,UVector32 *other,UErrorCode *ec)

{
  int32_t *piVar1;
  int32_t *piVar2;
  UBool UVar3;
  long lVar4;
  
  UVar3 = ensureCapacity(this,other->count,ec);
  if (UVar3 != '\0') {
    setSize(this,other->count);
    piVar1 = other->elements;
    piVar2 = this->elements;
    for (lVar4 = 0; lVar4 < other->count; lVar4 = lVar4 + 1) {
      piVar2[lVar4] = piVar1[lVar4];
    }
  }
  return;
}

Assistant:

void UVector32::assign(const UVector32& other, UErrorCode &ec) {
    if (ensureCapacity(other.count, ec)) {
        setSize(other.count);
        for (int32_t i=0; i<other.count; ++i) {
            elements[i] = other.elements[i];
        }
    }
}